

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v9::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  int iVar1;
  type tVar2;
  buffer<char> *this;
  buffer<char> *pbVar3;
  size_t sVar4;
  size_t sVar5;
  ulong __maxlen;
  char *pcVar6;
  buffer<char> *in_RDX;
  undefined8 in_RSI;
  uint in_EDI;
  undefined8 in_XMM0_Qa;
  type size;
  int result;
  _func_int_char_ptr_size_t_char_ptr_varargs *snprintf_ptr;
  size_t capacity;
  char *begin;
  size_t offset;
  char *format_ptr;
  char format [7];
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  buffer<char> *in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 uVar7;
  char cVar8;
  char *local_30;
  char local_27 [7];
  buffer<char> *local_20;
  uint local_14;
  undefined8 local_10;
  uint uStack_4;
  
  uStack_4 = (uint)((ulong)in_RSI >> 0x20);
  local_20 = in_RDX;
  local_14 = in_EDI;
  local_10 = in_XMM0_Qa;
  this = (buffer<char> *)buffer<char>::capacity(in_RDX);
  pbVar3 = (buffer<char> *)buffer<char>::size(local_20);
  if (this <= pbVar3) {
    assert_fail((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(char *)0x1dd558);
  }
  if ((char)uStack_4 == '\x03') {
    local_30 = local_27 + 1;
    local_27[0] = '%';
    if ((uStack_4 >> 0x13 & 1) != 0) {
      local_30 = local_27 + 2;
      local_27[1] = 0x23;
    }
    if (-1 < (int)local_14) {
      pcVar6 = local_30 + 1;
      *local_30 = '.';
      local_30 = local_30 + 2;
      *pcVar6 = '*';
    }
    uVar7 = 0x61;
    cVar8 = 'A';
    if ((uStack_4 & 0x10000) == 0) {
      cVar8 = 'a';
    }
    *local_30 = cVar8;
    local_30[1] = '\0';
    sVar4 = buffer<char>::size(local_20);
    while( true ) {
      while( true ) {
        pcVar6 = buffer<char>::data(local_20);
        sVar5 = buffer<char>::capacity(local_20);
        __maxlen = sVar5 - sVar4;
        abort_fuzzing_if(false);
        if ((int)local_14 < 0) {
          iVar1 = snprintf(pcVar6 + sVar4,__maxlen,local_27,local_10,snprintf);
        }
        else {
          iVar1 = snprintf(pcVar6 + sVar4,__maxlen,local_27,local_10,(ulong)local_14,snprintf);
        }
        if (-1 < iVar1) break;
        in_stack_ffffffffffffff90 = local_20;
        buffer<char>::capacity(local_20);
        buffer<char>::try_reserve
                  (in_stack_ffffffffffffff90,
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      tVar2 = to_unsigned<int>(0);
      if (tVar2 < __maxlen) break;
      buffer<char>::try_reserve
                (in_stack_ffffffffffffff90,
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    buffer<char>::try_resize
              (this,CONCAT17(cVar8,CONCAT16(uVar7,CONCAT24(in_stack_ffffffffffffff9c,iVar1))));
    return 0;
  }
  assert_fail((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(char *)0x1dd57f);
}

Assistant:

auto snprintf_float(T value, int precision, float_specs specs,
                    buffer<char>& buf) -> int {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  FMT_ASSERT(specs.format == float_format::hex, "");
  static_assert(!std::is_same<T, float>::value, "");

  // Build the format string.
  char format[7];  // The longest format is "%#.*Le".
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.upper ? 'A' : 'a';
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
    abort_fuzzing_if(precision > 100000);
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size < capacity) {
      buf.try_resize(size + offset);
      return 0;
    }
    buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
  }
}